

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  _Rb_tree_header *p_Var1;
  double dVar2;
  size_t sVar3;
  int iVar4;
  unsigned_long k;
  long lVar5;
  ostream *poVar6;
  char *pcVar7;
  Vector *pVVar8;
  unsigned_long uVar9;
  char *pcVar10;
  undefined4 *puVar11;
  _Base_ptr p_Var12;
  ulong *puVar13;
  undefined8 *puVar14;
  size_t sVar15;
  FILE *pFVar16;
  unsigned_long uVar17;
  ulong uVar18;
  ambig_t aVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  sequence_gap_structure *psVar23;
  sequence_gap_structure *sequence_descriptor2;
  _Self __tmp;
  const_iterator cVar24;
  _Base_ptr p_Var25;
  undefined4 uVar26;
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  char automatonState;
  _Self __tmp_1;
  time_t before;
  undefined8 *local_158;
  time_t after;
  long firstSequenceLength;
  char *local_140;
  FILE *local_138;
  Clusters clusters;
  unsigned_long local_110;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> remaining;
  args_t args;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> join_to;
  
  argparse::args_t::args_t(&args,argc,argv);
  firstSequenceLength = 0;
  remaining._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &remaining._M_t._M_impl.super__Rb_tree_header._M_header;
  remaining._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  remaining._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  remaining._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  clusters.allocated_clusters = 0x80;
  clusters.cluster_count = 0;
  clusters.unused = 0;
  remaining._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       remaining._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  clusters.list_of_clusters = (Vector **)operator_new__(0x400);
  lVar5 = 0;
  do {
    clusters.list_of_clusters[lVar5] = (Vector *)0x0;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x80);
  automatonState = '\0';
  Vector::appendValue(&nameLengths,0);
  Vector::appendValue(&seqLengths,0);
  initAlphabets(false,args.ambigs_to_resolve,false);
  iVar4 = readFASTA(args.input,&automatonState,&names,&sequences,&nameLengths,&seqLengths,
                    &firstSequenceLength,false,(Vector *)0x0,':',1.0,false);
  iVar22 = 1;
  if (iVar4 != 1) {
    uVar20 = seqLengths.vLength - 1;
    if (args.quiet == false) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Read ",5);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," sequences from input file ",0x1b);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      poVar6 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Will perform approximately ",0x1b);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6," pairwise distance calculations",0x1f);
    }
    resolve_fraction = args.resolve_fraction;
    local_158 = (undefined8 *)operator_new__(-(ulong)(uVar20 >> 0x3b != 0) | uVar20 * 0x20);
    if (uVar20 != 0) {
      puVar14 = local_158;
      do {
        *puVar14 = 0x7fffffffffffffff;
        puVar14[1] = 0;
        puVar14[2] = 0;
        puVar14[3] = 0;
        puVar14 = puVar14 + 4;
      } while (puVar14 != local_158 + uVar20 * 4);
      before = 0;
      if (uVar20 != 0) {
        do {
          pcVar7 = stringText(&sequences,&seqLengths,before);
          describe_sequence((sequence_gap_structure *)&join_to,pcVar7,firstSequenceLength,4);
          local_158[before * 4 + 2] = join_to._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
          ;
          (local_158 + before * 4 + 2)[1] =
               join_to._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          local_158[before * 4] = join_to._M_t._M_impl._0_8_;
          (local_158 + before * 4)[1] =
               CONCAT44(join_to._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                        join_to._M_t._M_impl.super__Rb_tree_header._M_header._M_color);
          if ((before != 0) || (uVar18 = 1, args.first_regular != false)) {
            std::
            _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
            ::_M_insert_unique<unsigned_long_const&>
                      ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                        *)&remaining,(unsigned_long *)&before);
            uVar18 = before + 1;
          }
          before = uVar18;
        } while (uVar18 < uVar20);
      }
    }
    if (args.quiet == false) {
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'H');
      std::ostream::put('H');
      poVar6 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Progress: ",10);
    }
    aVar19 = resolve;
    if (args.ambig < (subset|average)) {
      aVar19 = args.ambig;
    }
    time(&before);
    local_138 = (FILE *)CONCAT44(local_138._4_4_,(int)(char)aVar19);
    p_Var1 = &remaining._M_t._M_impl.super__Rb_tree_header;
    uVar26 = (undefined4)(uVar20 >> 0x20);
    if (args.cluster_type == all) {
      if ((_Rb_tree_header *)remaining._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
          p_Var1) {
        dVar27 = ((double)CONCAT44(0x45300000,uVar26) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar20) - 4503599627370496.0);
        cVar24._M_node = remaining._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          uVar9 = *(unsigned_long *)(cVar24._M_node + 1);
          local_140 = stringText(&sequences,&seqLengths,uVar9);
          pVVar8 = Clusters::append_a_cluster(&clusters,uVar9);
          std::
          _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
          ::erase_abi_cxx11_((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                              *)&remaining,cVar24);
          if ((_Rb_tree_header *)remaining._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
              &remaining._M_t._M_impl.super__Rb_tree_header) {
            psVar23 = (sequence_gap_structure *)(local_158 + uVar9 * 4);
            __tmp_1._M_node = remaining._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            do {
              uVar9 = *(unsigned_long *)(__tmp_1._M_node + 1);
              pcVar7 = stringText(&sequences,&seqLengths,uVar9);
              sequence_descriptor2 = (sequence_gap_structure *)(local_158 + uVar9 * 4);
              dVar2 = computeTN93(local_140,pcVar7,firstSequenceLength,(char)local_138,(long *)0x0,
                                  args.overlap,(unsigned_long *)0x0,200.0,200,1,1,psVar23,
                                  sequence_descriptor2);
              if (args.distance < dVar2) {
                puVar14 = (undefined8 *)__cxa_allocate_exception(8);
                *puVar14 = 0;
                __cxa_throw(puVar14,&unsigned_long::typeinfo,0);
              }
              if (1 < pVVar8->vLength) {
                uVar18 = 1;
                do {
                  uVar17 = Vector::value(pVVar8,uVar18);
                  pcVar10 = stringText(&sequences,&seqLengths,uVar17);
                  dVar2 = computeTN93(pcVar7,pcVar10,firstSequenceLength,(char)local_138,(long *)0x0
                                      ,args.overlap,(unsigned_long *)0x0,200.0,200,1,1,
                                      sequence_descriptor2,
                                      (sequence_gap_structure *)(local_158 + uVar17 * 4));
                  if ((dVar2 < 0.0) || (args.distance < dVar2)) {
                    puVar13 = (ulong *)__cxa_allocate_exception(8);
                    *puVar13 = uVar18;
                    __cxa_throw(puVar13,&unsigned_long::typeinfo,0);
                  }
                  uVar18 = uVar18 + 1;
                } while (uVar18 < pVVar8->vLength);
              }
              Vector::appendValue(pVVar8,uVar9);
              __tmp_1._M_node =
                   (_Base_ptr)
                   std::
                   _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                   ::erase_abi_cxx11_((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                                       *)&remaining,__tmp_1._M_node);
              if (args.quiet == false) {
                time(&after);
                dVar2 = difftime(after,before);
                sVar3 = remaining._M_t._M_impl.super__Rb_tree_header._M_node_count;
                if (0.0 < dVar2) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,
                             "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\bProgress:"
                             ,0x5f);
                  lVar5 = uVar20 - sVar3;
                  auVar29._8_4_ = (int)((ulong)lVar5 >> 0x20);
                  auVar29._0_8_ = lVar5;
                  auVar29._12_4_ = 0x45300000;
                  *(undefined8 *)(std::ios_base::Init::~Init + *(long *)(std::cerr + -0x18)) = 8;
                  poVar6 = std::ostream::_M_insert<double>
                                     ((((auVar29._8_8_ - 1.9342813113834067e+25) +
                                       ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0
                                       )) * 100.0) / dVar27);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"% (",3);
                  *(undefined8 *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x10) = 8;
                  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar6," clusters created, ",0x13);
                  lVar5 = *(long *)poVar6;
                  *(undefined8 *)(poVar6 + *(long *)(lVar5 + -0x18) + 0x10) = 0xc;
                  *(undefined8 *)(poVar6 + *(long *)(lVar5 + -0x18) + 8) = 3;
                  poVar6 = std::ostream::_M_insert<double>
                                     ((dVar27 - (((double)CONCAT44(0x45300000,
                                                                   (int)(remaining._M_t._M_impl.
                                                                         super__Rb_tree_header.
                                                                         _M_node_count >> 0x20)) -
                                                 1.9342813113834067e+25) +
                                                ((double)CONCAT44(0x43300000,
                                                                  (int)remaining._M_t._M_impl.
                                                                       super__Rb_tree_header.
                                                                       _M_node_count) -
                                                4503599627370496.0))) / dVar2);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar6," sequences clustered/sec)",0x19);
                  after = before;
                }
              }
            } while ((_Rb_tree_header *)__tmp_1._M_node !=
                     &remaining._M_t._M_impl.super__Rb_tree_header);
          }
          cVar24._M_node = remaining._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          if (args.quiet == false) {
            time(&after);
            p_Var25 = (_Base_ptr)difftime(after,before);
            sVar3 = remaining._M_t._M_impl.super__Rb_tree_header._M_node_count;
            if (0.0 < (double)p_Var25) {
              __tmp_1._M_node = p_Var25;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\bProgress:"
                         ,0x5f);
              lVar5 = uVar20 - sVar3;
              auVar30._8_4_ = (int)((ulong)lVar5 >> 0x20);
              auVar30._0_8_ = lVar5;
              auVar30._12_4_ = 0x45300000;
              *(undefined8 *)(std::ios_base::Init::~Init + *(long *)(std::cerr + -0x18)) = 8;
              poVar6 = std::ostream::_M_insert<double>
                                 ((((auVar30._8_8_ - 1.9342813113834067e+25) +
                                   ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) *
                                  100.0) / dVar27);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,"% (",3);
              *(undefined8 *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x10) = 8;
              poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6," clusters created, ",0x13);
              lVar5 = *(long *)poVar6;
              *(undefined8 *)(poVar6 + *(long *)(lVar5 + -0x18) + 0x10) = 0xc;
              *(undefined8 *)(poVar6 + *(long *)(lVar5 + -0x18) + 8) = 3;
              poVar6 = std::ostream::_M_insert<double>
                                 ((dVar27 - (((double)CONCAT44(0x45300000,
                                                               (int)(remaining._M_t._M_impl.
                                                                     super__Rb_tree_header.
                                                                     _M_node_count >> 0x20)) -
                                             1.9342813113834067e+25) +
                                            ((double)CONCAT44(0x43300000,
                                                              (int)remaining._M_t._M_impl.
                                                                   super__Rb_tree_header.
                                                                   _M_node_count) -
                                            4503599627370496.0))) / (double)__tmp_1._M_node);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar6," sequences clustered/sec)",0x19);
              after = before;
            }
          }
        } while ((_Rb_tree_header *)cVar24._M_node != &remaining._M_t._M_impl.super__Rb_tree_header)
        ;
      }
    }
    else if ((_Rb_tree_header *)remaining._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
             p_Var1) {
      dVar27 = ((double)CONCAT44(0x45300000,uVar26) - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar20) - 4503599627370496.0);
      __tmp_1._M_node = (_Base_ptr)0x0;
      cVar24._M_node = remaining._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        local_140 = *(char **)(cVar24._M_node + 1);
        pcVar7 = stringText(&sequences,&seqLengths,(unsigned_long)local_140);
        Clusters::remove_blanks(&clusters);
        join_to._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        join_to._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        join_to._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &join_to._M_t._M_impl.super__Rb_tree_header._M_header;
        join_to._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        join_to._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             join_to._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        std::
        _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
        ::erase_abi_cxx11_((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                            *)&remaining,cVar24);
        local_110 = 0;
        if (clusters.cluster_count != 0) {
          psVar23 = (sequence_gap_structure *)(local_158 + (long)local_140 * 4);
          do {
            pVVar8 = Clusters::operator[](&clusters,local_110);
            if (pVVar8->vLength != 0) {
              uVar18 = 0;
              do {
                uVar9 = Vector::value(pVVar8,uVar18);
                pcVar10 = stringText(&sequences,&seqLengths,uVar9);
                dVar2 = computeTN93(pcVar7,pcVar10,firstSequenceLength,(char)local_138,(long *)0x0,
                                    args.overlap,(unsigned_long *)0x0,200.0,200,1,1,psVar23,
                                    (sequence_gap_structure *)(local_158 + uVar9 * 4));
                if ((0.0 <= dVar2) && (dVar2 <= args.distance)) {
                  puVar11 = (undefined4 *)__cxa_allocate_exception(4);
                  *puVar11 = 0;
                  __cxa_throw(puVar11,&int::typeinfo,0);
                }
                uVar18 = uVar18 + 1;
              } while (uVar18 < pVVar8->vLength);
            }
            local_110 = local_110 + 1;
          } while (local_110 < clusters.cluster_count);
        }
        p_Var12 = join_to._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        if (join_to._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
          Clusters::append_a_cluster(&clusters,(unsigned_long)local_140);
        }
        else {
          uVar9 = *(unsigned_long *)
                   (join_to._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1);
          pVVar8 = Clusters::operator[](&clusters,uVar9);
          Vector::appendValue(pVVar8,(long)local_140);
          while (p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12),
                (_Rb_tree_header *)p_Var12 != &join_to._M_t._M_impl.super__Rb_tree_header) {
            Clusters::merge_clusters(&clusters,uVar9,*(unsigned_long *)(p_Var12 + 1));
            __tmp_1._M_node = (_Base_ptr)((long)&(__tmp_1._M_node)->_M_color + 1);
          }
        }
        cVar24._M_node = remaining._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        if (args.quiet == false) {
          time(&after);
          pcVar7 = (char *)difftime(after,before);
          sVar3 = remaining._M_t._M_impl.super__Rb_tree_header._M_node_count;
          if (0.0 < (double)pcVar7) {
            local_140 = pcVar7;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\bProgress:"
                       ,0x70);
            lVar5 = uVar20 - sVar3;
            auVar28._8_4_ = (int)((ulong)lVar5 >> 0x20);
            auVar28._0_8_ = lVar5;
            auVar28._12_4_ = 0x45300000;
            *(undefined8 *)(std::ios_base::Init::~Init + *(long *)(std::cerr + -0x18)) = 8;
            poVar6 = std::ostream::_M_insert<double>
                               ((((auVar28._8_8_ - 1.9342813113834067e+25) +
                                 ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) *
                                100.0) / dVar27);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"% (",3);
            *(undefined8 *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x10) = 8;
            poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"[",1);
            *(undefined8 *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x10) = 8;
            poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6,"] clusters created [merged], ",0x1d);
            lVar5 = *(long *)poVar6;
            *(undefined8 *)(poVar6 + *(long *)(lVar5 + -0x18) + 0x10) = 0xc;
            *(undefined8 *)(poVar6 + *(long *)(lVar5 + -0x18) + 8) = 3;
            poVar6 = std::ostream::_M_insert<double>
                               ((dVar27 - (((double)CONCAT44(0x45300000,
                                                             (int)(remaining._M_t._M_impl.
                                                                   super__Rb_tree_header.
                                                                   _M_node_count >> 0x20)) -
                                           1.9342813113834067e+25) +
                                          ((double)CONCAT44(0x43300000,
                                                            (int)remaining._M_t._M_impl.
                                                                 super__Rb_tree_header._M_node_count
                                                           ) - 4503599627370496.0))) /
                                (double)local_140);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6," sequences clustered/sec)",0x19);
            after = before;
          }
        }
        std::
        _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
        ::~_Rb_tree(&join_to._M_t);
      } while ((_Rb_tree_header *)cVar24._M_node != &remaining._M_t._M_impl.super__Rb_tree_header);
    }
    if (args.quiet == false) {
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'H');
      std::ostream::put('H');
      poVar6 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Created ",8);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," clusters",9);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
    }
    Clusters::remove_blanks(&clusters);
    pcVar7 = args.trunk_path;
    if (args.output_mode == json) {
      pFVar16 = _stdout;
      if ((args.trunk_path != (char *)0x0) &&
         (pFVar16 = fopen(args.trunk_path,"w"), pFVar16 == (FILE *)0x0)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Failed to open \'",0x10);
        poVar6 = std::operator<<((ostream *)&std::cerr,args.trunk_path);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\' for writing",0xd);
        std::endl<char,std::char_traits<char>>(poVar6);
LAB_00105a3e:
        exit(0);
      }
      fputc(0x5b,pFVar16);
      if (clusters.cluster_count != 0) {
        p_Var25 = (_Base_ptr)0x0;
        local_138 = pFVar16;
        do {
          pVVar8 = Clusters::operator[](&clusters,(unsigned_long)p_Var25);
          if (p_Var25 != (_Base_ptr)0x0) {
            fputc(0x2c,pFVar16);
          }
          __tmp_1._M_node = p_Var25;
          fprintf(pFVar16,"\n\t{\n\t\t\"size\" : %ld, \n\t\t\"members\" : [",pVVar8->vLength);
          if (pVVar8->vLength == 0) {
            uVar9 = 0;
          }
          else {
            uVar18 = 0;
            uVar9 = 0;
            uVar20 = 0;
            do {
              pcVar7 = ",\"%s\"";
              if (uVar18 == 0) {
                pcVar7 = "\"%s\"";
              }
              uVar17 = Vector::value(pVVar8,uVar18);
              pcVar10 = stringText(&names,&nameLengths,uVar17);
              fprintf(local_138,pcVar7,pcVar10);
              uVar17 = Vector::value(pVVar8,uVar18);
              pcVar7 = stringText(&sequences,&seqLengths,uVar17);
              if (firstSequenceLength != 0) {
                lVar5 = 0;
                uVar21 = 0;
                do {
                  uVar21 = uVar21 + (resolutionsCount[(byte)pcVar7[lVar5]] == 1.0);
                  lVar5 = lVar5 + 1;
                } while (firstSequenceLength != lVar5);
                if (uVar20 < uVar21) {
                  uVar9 = Vector::value(pVVar8,uVar18);
                  uVar20 = uVar21;
                }
              }
              uVar18 = uVar18 + 1;
            } while (uVar18 < pVVar8->vLength);
          }
          pcVar7 = stringText(&names,&nameLengths,uVar9);
          pFVar16 = local_138;
          fprintf(local_138,"],\n\t\t\"centroid\" : \">%s\\n",pcVar7);
          pcVar7 = stringText(&sequences,&seqLengths,uVar9);
          dump_fasta(pcVar7,firstSequenceLength,(FILE *)pFVar16,false,false,0,0);
          fwrite("\\n\"\n\t}",6,1,pFVar16);
          p_Var25 = (_Base_ptr)((long)&(__tmp_1._M_node)->_M_color + 1);
        } while (p_Var25 < clusters.cluster_count);
      }
      fwrite("\n]\n",3,1,pFVar16);
      if (args.trunk_path != (char *)0x0) {
        fclose(pFVar16);
      }
    }
    else {
      if (args.trunk_path == (char *)0x0) {
        pcVar10 = (char *)0x0;
        sVar15 = 0;
      }
      else {
        sVar15 = strlen(args.trunk_path);
        sVar15 = sVar15 + 0x80;
        pcVar10 = (char *)operator_new__(sVar15);
      }
      if (clusters.cluster_count != 0) {
        uVar9 = 0;
        do {
          pVVar8 = Clusters::operator[](&clusters,uVar9);
          pFVar16 = _stdout;
          if (args.trunk_path == (char *)0x0) {
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
            std::ostream::put('x');
            poVar6 = (ostream *)std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6,"============================",0x1c);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
            std::ostream::put((char)poVar6);
            std::ostream::flush();
          }
          else {
            snprintf(pcVar10,sVar15,"%s.%lu");
            pFVar16 = fopen(pcVar10,"w");
            if (pFVar16 == (FILE *)0x0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Failed to open \'",0x10);
              poVar6 = std::operator<<((ostream *)&std::cerr,pcVar10);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\' for writing",0xd);
              std::endl<char,std::char_traits<char>>(poVar6);
              goto LAB_00105a3e;
            }
          }
          if (pVVar8->vLength != 0) {
            uVar20 = 0;
            do {
              uVar17 = Vector::value(pVVar8,uVar20);
              dump_sequence_fasta(uVar17,(FILE *)pFVar16,firstSequenceLength,(double *)0x0,false,0,0
                                 );
              uVar20 = uVar20 + 1;
            } while (uVar20 < pVVar8->vLength);
          }
          if (args.trunk_path != (char *)0x0) {
            fclose(pFVar16);
          }
          uVar9 = uVar9 + 1;
          pcVar7 = args.trunk_path;
        } while (uVar9 < clusters.cluster_count);
      }
      if ((pcVar10 != (char *)0x0) && (pcVar7 != (char *)0x0)) {
        operator_delete__(pcVar10);
      }
    }
    operator_delete__(local_158);
    iVar22 = 0;
  }
  Clusters::~Clusters(&clusters);
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree(&remaining._M_t);
  argparse::args_t::~args_t(&args);
  return iVar22;
}

Assistant:

int main(int argc, const char *argv[]) {
  args_t args = args_t(argc, argv);

  long firstSequenceLength = 0;

  set<unsigned long> remaining; // sequence ids not yet clustered

  Clusters clusters;

  char automatonState = 0;
  // 0 - between sequences
  // 1 - reading sequence name
  // 2 - reading sequence

  nameLengths.appendValue(0);
  seqLengths.appendValue(0);

  initAlphabets(false, args.ambigs_to_resolve);
  if (readFASTA(args.input, automatonState, names, sequences, nameLengths,
                seqLengths, firstSequenceLength) == 1)
    return 1;

  unsigned long sequenceCount = seqLengths.length() - 1,
                pairwise = (sequenceCount - 1L) * (sequenceCount) / 2;

  if (!args.quiet) {
    cerr << "Read " << sequenceCount << " sequences from input file " << endl
         << "Will perform approximately " << pairwise
         << " pairwise distance calculations";
  }

  sequence_gap_structure *sequence_descriptors = NULL;

  resolve_fraction = args.resolve_fraction;

  double percentDone = 0.;

  sequence_descriptors = new sequence_gap_structure[sequenceCount];
  for (unsigned long sid = 0UL; sid < sequenceCount; sid++) {
    sequence_descriptors[sid] = describe_sequence(
        stringText(sequences, seqLengths, sid), firstSequenceLength);
    if (args.first_regular || sid > 0UL) {
      remaining.insert(sid);
    }
  }

  if (!args.quiet)
    cerr << endl << "Progress: ";

  int resolutionOption;
  switch (args.ambig) {
  case resolve:
    resolutionOption = RESOLVE;
    break;
  case average:
    resolutionOption = AVERAGE;
    break;
  case skip:
    resolutionOption = SKIP;
    break;
  case gapmm:
    resolutionOption = GAPMM;
    break;
  case subset:
    resolutionOption = SUBSET;
    break;
  }

  time_t before, after;
  time(&before);

  if (args.cluster_type == all) {

    auto outer_iterator = remaining.begin();

    while (outer_iterator != remaining.end()) {

      unsigned long seq1 = *outer_iterator;

      char *base_sequence = stringText(sequences, seqLengths, seq1);

      Vector *current_cluster = clusters.append_a_cluster(seq1);

      outer_iterator = remaining.erase(outer_iterator);

      auto inner_iterator = remaining.begin();

      while (inner_iterator != remaining.end()) {

        unsigned long seq2 = *inner_iterator;
        char *test_sequence = stringText(sequences, seqLengths, seq2);

        try {
          double distance = computeTN93(
              base_sequence, test_sequence, firstSequenceLength,
              resolutionOption, NULL, args.overlap, NULL, HISTOGRAM_SLICE,
              HISTOGRAM_BINS, 1L, 1L, &sequence_descriptors[seq1],
              &sequence_descriptors[seq2]);

          if (distance <= args.distance) {
            // check if this can be merged into the current cluster
            for (unsigned long current_cluster_seq = 1UL;
                 current_cluster_seq < current_cluster->length();
                 current_cluster_seq++) {
              unsigned long csi = current_cluster->value(current_cluster_seq);
              double d = computeTN93(
                  test_sequence, stringText(sequences, seqLengths, csi),
                  firstSequenceLength, resolutionOption, NULL, args.overlap,
                  NULL, HISTOGRAM_SLICE, HISTOGRAM_BINS, 1L, 1L,
                  &sequence_descriptors[seq2], &sequence_descriptors[csi]);
                if (d > args.distance || d < 0.) {
                    throw(current_cluster_seq);
                }
            }
          } else {
            throw(0UL);
          }
          current_cluster->appendValue(seq2);
          //cerr << "removing " << seq2 << " : " << remaining.size() << " / " << current_cluster->length() << endl;
          inner_iterator = remaining.erase(inner_iterator);
            if (!args.quiet) {
              time(&after);
              double dt = difftime(after, before);
              if (dt > 0.) {
                percentDone =
                    (sequenceCount - remaining.size()) * 100. / sequenceCount;
                cerr << "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b"
                        "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b"
                        "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\bProgress"
                        ":"
                     << setw(8) << percentDone << "% (" << setw(8) << clusters.size()
                     << " clusters created, " << setw(12) << std::setprecision(3)
                     << ((double)sequenceCount - remaining.size()) / dt
                     << " sequences clustered/sec)";

                after = before;
              }
            }
        } catch (unsigned long e) {
          //cerr << "mismatch at " << e << endl;
          inner_iterator++;
        }
      }

      outer_iterator = remaining.begin();
      if (!args.quiet) {
        time(&after);
        double dt = difftime(after, before);
        if (dt > 0.) {
          percentDone =
              (sequenceCount - remaining.size()) * 100. / sequenceCount;
          cerr << "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b"
                  "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b"
                  "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\bProgress"
                  ":"
               << setw(8) << percentDone << "% (" << setw(8) << clusters.size()
               << " clusters created, " << setw(12) << std::setprecision(3)
               << ((double)sequenceCount - remaining.size()) / dt
               << " sequences clustered/sec)";

          after = before;
        }
      }
    }
  } else {
    auto outer_iterator = remaining.begin();

    // the idea here is to first iterate over all existing clusters
    // if the remaining sequence can be joined to some of the clusters,
    // then these clusters will be joined together and augmented with the new
    // sequence

    // failing that, the new sequence gets its own cluster

    unsigned long mergers = 0UL;

    while (outer_iterator != remaining.end()) {

      unsigned long seq1 = *outer_iterator;
      char *base_sequence = stringText(sequences, seqLengths, seq1);

      clusters.remove_blanks();

      set<unsigned long> join_to;

      outer_iterator = remaining.erase(outer_iterator);

#pragma omp parallel shared(clusters, sequence_descriptors, resolutionOption,  \
                            sequences, seqLengths, sequenceCount,              \
                            firstSequenceLength, args, nameLengths, names,     \
                            percentDone, cerr)
      for (unsigned long cc = 0UL; cc < clusters.size(); cc++) {
        Vector const *this_cluster = clusters[cc];

        try {
          for (unsigned long seq = 0UL; seq < this_cluster->length(); seq++) {
            unsigned long csi = this_cluster->value(seq);
            double d = computeTN93(
                base_sequence, stringText(sequences, seqLengths, csi),
                firstSequenceLength, resolutionOption, NULL, args.overlap, NULL,
                HISTOGRAM_SLICE, HISTOGRAM_BINS, 1L, 1L,
                &sequence_descriptors[seq1], &sequence_descriptors[csi]);
            if (d >= 0. && d <= args.distance) {
              throw(0);
            }
          }
        } catch (int e) {
#pragma omp critical
          join_to.insert(cc);
        }
      }

      if (join_to.empty()) {
        // create new cluster
        clusters.append_a_cluster(seq1);

      } else {
        auto cluster_iterator = join_to.begin();
        unsigned long first = *cluster_iterator;
        clusters[first]->appendValue(seq1);
        cluster_iterator++;
        while (cluster_iterator != join_to.end()) {
          // cout << "Merging " << first << " and " << *cluster_iterator << " on
          // " << seq1 << endl;
          clusters.merge_clusters(first, *cluster_iterator);
          mergers++;
          cluster_iterator++;
        }
      }

      outer_iterator = remaining.begin();
      if (!args.quiet) {
        time(&after);
        double dt = difftime(after, before);
        if (dt > 0.) {
          percentDone =
              (sequenceCount - remaining.size()) * 100. / sequenceCount;
          cerr << "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b"
                  "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b"
                  "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b"
                  "\b\b\b\b\b\b\b\b\b\b\b\b\bProgress:"
               << setw(8) << percentDone << "% (" << setw(8) << clusters.size()
               << "[" << setw(8) << mergers << "] clusters created [merged], "
               << setw(12) << std::setprecision(3)
               << ((double)sequenceCount - remaining.size()) / dt
               << " sequences clustered/sec)";

          after = before;
        }
      }
    }
  }

  if (!args.quiet) {
    cerr << endl << "Created " << clusters.size() << " clusters" << endl;
  }
  clusters.remove_blanks();

  if (args.output_mode == json) {
    FILE *print_to;

    if (args.trunk_path) {
      print_to = fopen(args.trunk_path, "w");
      if (!print_to) {
        cerr << "Failed to open '" << args.trunk_path << "' for writing"
             << endl;
        exit(0);
      }
    } else {
      print_to = stdout;
    }

    fprintf(print_to, "[");
    for (unsigned long cid = 0; cid < clusters.size(); cid++) {
      Vector *this_cluster = clusters[cid];
      if (cid) {
        fprintf(print_to, ",");
      }

      unsigned long max_nongap = 0UL, max_id = 0UL;

      fprintf(print_to, "\n\t{\n\t\t\"size\" : %ld, \n\t\t\"members\" : [",
              this_cluster->length());
      for (unsigned long p = 0; p < this_cluster->length(); p++) {
        fprintf(print_to, p ? ",\"%s\"" : "\"%s\"",
                stringText(names, nameLengths, this_cluster->value(p)));
        unsigned char *s = (unsigned char *)stringText(sequences, seqLengths,
                                                       this_cluster->value(p));
        unsigned long my_non_gap = 0UL;
        for (unsigned long ci = 0; ci < firstSequenceLength; ci++) {
          if (resolutionsCount[s[ci]] == 1.f) {
            my_non_gap++;
          }
        }
        if (my_non_gap > max_nongap) {
          max_nongap = my_non_gap;
          max_id = this_cluster->value(p);
        }
      }
      fprintf(print_to, "],\n\t\t\"centroid\" : \">%s\\n",
              stringText(names, nameLengths, max_id));
      dump_fasta(stringText(sequences, seqLengths, max_id), firstSequenceLength,
                 print_to, false);
      // dump_sequence_fasta (max_id, print_to, firstSequenceLength);
      fprintf(print_to, "\\n\"\n\t}");
    }
    fprintf(print_to, "\n]\n");

    if (args.trunk_path) {
      fclose(print_to);
    }

  } else {
    char *path_buffer = NULL;
    unsigned long pl = 0UL;
    if (args.trunk_path) {
      pl = strlen(args.trunk_path) + 128;
      path_buffer = new char[pl];
    }
    for (unsigned long cid = 0; cid < clusters.size(); cid++) {
      Vector *this_cluster = clusters[cid];

      FILE *print_to;

      if (args.trunk_path) {
        snprintf(path_buffer, pl, "%s.%lu", args.trunk_path, cid);
        // cout << path_buffer << endl;
        print_to = fopen(path_buffer, "w");
        if (!print_to) {
          cerr << "Failed to open '" << path_buffer << "' for writing" << endl;
          exit(0);
        }
      } else {
        print_to = stdout;
        cout << endl << "============================" << endl;
      }
      for (unsigned long p = 0; p < this_cluster->length(); p++) {
        long mapped_id = this_cluster->value(p);
        // cout << mapped_id << endl;
        dump_sequence_fasta(mapped_id, print_to, firstSequenceLength);
      }

      if (args.trunk_path) {
        fclose(print_to);
      }
    }
    if (args.trunk_path) {
      delete[] path_buffer;
    }
  }

  delete[] sequence_descriptors;
  return 0;
}